

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# includes.hpp
# Opt level: O0

double cvs_rk::HK<cvs_rk::mod_int<9223372036854775783ul>>
                 (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                  *S)

{
  size_type sVar1;
  reference pvVar2;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  ulint k_1;
  ulint k;
  double M;
  double Hk;
  vector<unsigned_long,_std::allocator<unsigned_long>_> m_k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  ulong local_40;
  ulong local_38;
  double local_30;
  double local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_20;
  
  get_counts_mk<cvs_rk::mod_int<9223372036854775783ul>>(in_RDI);
  local_28 = 0.0;
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  local_30 = 0.0;
  local_38 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_20);
    auVar4 = auVar6._0_16_;
    if (sVar1 <= local_38) break;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_20,local_38);
    auVar4 = vcvtusi2sd_avx512f(auVar4,local_38 * *pvVar2);
    local_30 = auVar4._0_8_ + local_30;
    auVar6 = ZEXT864((ulong)local_30);
    local_38 = local_38 + 1;
  }
  local_40 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_20);
    if (sVar1 <= local_40) break;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_20,local_40);
    auVar4 = auVar6._0_16_;
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_20,local_40);
      auVar4 = vcvtusi2sd_avx512f(auVar4,local_40 * *pvVar2);
      auVar5._0_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (auVar4._0_8_ / local_30);
      auVar5._8_8_ = auVar4._8_8_;
      in_stack_ffffffffffffffa0 = auVar5._0_8_;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_20,local_40);
      auVar4 = vcvtusi2sd_avx512f(auVar5,local_40 * *pvVar2);
      dVar3 = log(auVar4._0_8_ / local_30);
      local_28 = local_28 - (double)in_stack_ffffffffffffffa0 * dVar3;
      auVar6 = ZEXT864((ulong)local_28);
    }
    local_40 = local_40 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffffa0);
  return local_28;
}

Assistant:

double HK(vector<T> S){

	auto m_k = get_counts_mk<T>(S);

	double Hk = 0;
	double M = 0;

	for(ulint k=0;k<m_k.size();++k){

		M += k*m_k[k];

	}

	for(ulint k=0;k<m_k.size();++k){

		if(m_k[k]>0) Hk -= (double(k*m_k[k])/M) * log(double(k*m_k[k])/M);

	}

	return Hk;

}